

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void QUnifiedTimer::resumeAnimationTimer(QAbstractAnimationTimer *timer)

{
  long lVar1;
  QUnifiedTimer *t;
  QList<QAbstractAnimationTimer_*> *in_RDI;
  long in_FS_OFFSET;
  QUnifiedTimer *inst;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->d).size & 0x100) != 0) {
    *(undefined1 *)((long)&(in_RDI->d).size + 1) = 0;
    t = instance();
    QList<QAbstractAnimationTimer*>::removeOne<QAbstractAnimationTimer*>
              (in_RDI,(QAbstractAnimationTimer **)t);
    localRestart(inst);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUnifiedTimer::resumeAnimationTimer(QAbstractAnimationTimer *timer)
{
    if (!timer->isPaused)
        return;

    timer->isPaused = false;
    QUnifiedTimer *inst = QUnifiedTimer::instance();
    inst->pausedAnimationTimers.removeOne(timer);
    inst->localRestart();
}